

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void printOptionValues(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  TidyConfigCategory TVar1;
  ctmbstr ptVar2;
  TidyIterator local_38;
  TidyIterator itAttr;
  TidyIterator pos;
  OptionDesc *pOStack_20;
  TidyOptionId optId;
  OptionDesc *d_local;
  TidyOption topt_local;
  TidyDoc tdoc_local;
  
  pOStack_20 = d;
  d_local = (OptionDesc *)topt;
  topt_local = (TidyOption)tdoc;
  pos._4_4_ = tidyOptGetId(topt);
  TVar1 = tidyOptGetCategory((TidyOption)d_local);
  if (TVar1 != TidyInternalCategory) {
    if ((((pos._4_4_ == TidyBlockTags) || (pos._4_4_ == TidyEmptyTags)) ||
        (pos._4_4_ == TidyInlineTags)) || (pos._4_4_ == TidyPreTags)) {
      itAttr = tidyOptGetDeclTagList((TidyDoc)topt_local);
      while (itAttr != (TidyIterator)0x0) {
        ptVar2 = tidyOptGetNextDeclTag((TidyDoc)topt_local,pos._4_4_,&itAttr);
        pOStack_20->def = ptVar2;
        if (itAttr != (TidyIterator)0x0) {
          printf("%-27.27s %-9.9s  %-40.40s\n",pOStack_20->name,pOStack_20->type,pOStack_20->def);
          pOStack_20->name = "";
          pOStack_20->type = "";
        }
      }
    }
    else if (((pos._4_4_ == TidyPriorityAttributes) &&
             (local_38 = tidyOptGetPriorityAttrList((TidyDoc)topt_local),
             local_38 != (TidyIterator)0x0)) && (local_38 != (TidyIterator)0xffffffffffffffff)) {
      while (local_38 != (TidyIterator)0x0) {
        ptVar2 = tidyOptGetNextPriorityAttr((TidyDoc)topt_local,&local_38);
        pOStack_20->def = ptVar2;
        if (local_38 != (TidyIterator)0x0) {
          printf("%-27.27s %-9.9s  %-40.40s\n",pOStack_20->name,pOStack_20->type,pOStack_20->def);
          pOStack_20->name = "";
          pOStack_20->type = "";
        }
      }
    }
    if (((*pOStack_20->name != '\0') || (*pOStack_20->type != '\0')) ||
       ((pOStack_20->def != (ctmbstr)0x0 && (*pOStack_20->def != '\0')))) {
      if (pOStack_20->def == (ctmbstr)0x0) {
        pOStack_20->def = "";
      }
      printf("%-27.27s %-9.9s  %-40.40s\n",pOStack_20->name,pOStack_20->type,pOStack_20->def);
    }
  }
  return;
}

Assistant:

static void printOptionValues(TidyDoc ARG_UNUSED(tdoc),  /**< The Tidy document. */
                              TidyOption topt,           /**< The option for which to show values. */
                              OptionDesc *d              /**< The OptionDesc array. */
                              )
{
    TidyOptionId optId = tidyOptGetId( topt );

    if ( tidyOptGetCategory(topt) == TidyInternalCategory )
        return;

    switch ( optId )
    {
        case TidyInlineTags:
        case TidyBlockTags:
        case TidyEmptyTags:
        case TidyPreTags:
        {
            TidyIterator pos = tidyOptGetDeclTagList( tdoc );
            while ( pos )
            {
                d->def = tidyOptGetNextDeclTag(tdoc, optId, &pos);
                if ( pos )
                {
                    printf( fmt, d->name, d->type, d->def );
                    d->name = "";
                    d->type = "";
                }
            }
        }
            break;
        case TidyPriorityAttributes: /* Is #697 - This case seems missing */
        {
            TidyIterator itAttr = tidyOptGetPriorityAttrList(tdoc);
            if (itAttr && (itAttr != (TidyIterator)-1))
            {
                while (itAttr)
                {
                    d->def = tidyOptGetNextPriorityAttr(tdoc, &itAttr);
                    if (itAttr)
                    {
                        printf(fmt, d->name, d->type, d->def);
                        d->name = "";
                        d->type = "";
                    }
                }
            }
        }
            break;
        default:
            break;
    }

    /* fix for http://tidy.sf.net/bug/873921 */
    if ( *d->name || *d->type || (d->def && *d->def) )
    {
        if ( ! d->def )
            d->def = "";
        printf( fmt, d->name, d->type, d->def );
    }
}